

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall flow::lang::UnitSym::UnitSym(UnitSym *this)

{
  SourceLocation local_80;
  allocator<char> local_31;
  string local_30;
  UnitSym *local_10;
  UnitSym *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"#unit",&local_31);
  SourceLocation::SourceLocation(&local_80);
  ScopedSym::ScopedSym(&this->super_ScopedSym,Unit,(SymbolTable *)0x0,&local_30,&local_80);
  SourceLocation::~SourceLocation(&local_80);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_ScopedSym).super_Symbol.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__UnitSym_002c99a0;
  memset(&this->modules_,0,0x18);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->modules_);
  return;
}

Assistant:

UnitSym()
      : ScopedSym(Symbol::Unit, nullptr, "#unit", SourceLocation()),
        modules_() {}